

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombinatorNormalisationISE.cpp
# Opt level: O0

TermList __thiscall
Inferences::CombinatorNormalisationISE::createSCorBTerm
          (CombinatorNormalisationISE *this,TermList arg1,TermList arg1sort,TermList arg2,
          TermList arg2sort,Combinator comb)

{
  TermList TVar1;
  TermList TVar2;
  Term *in_RDX;
  int in_R9D;
  TermList c;
  TermList args [3];
  uint cb;
  TermList s3;
  TermList s2;
  TermList s1;
  TermList in_stack_fffffffffffffef8;
  TermList *in_stack_ffffffffffffff00;
  TermList in_stack_ffffffffffffff70;
  TermList in_stack_ffffffffffffff78;
  TermList in_stack_ffffffffffffff80;
  TermList in_stack_ffffffffffffff88;
  TermList local_40;
  int local_34;
  Term *local_18;
  
  local_34 = in_R9D;
  local_18 = in_RDX;
  Kernel::TermList::TermList(&local_40);
  Kernel::TermList::TermList((TermList *)&stack0xffffffffffffffb8);
  Kernel::TermList::TermList((TermList *)&stack0xffffffffffffffb0);
  Kernel::Signature::getCombinator((Signature *)arg1sort._content,arg2._content._4_4_);
  if ((local_34 == 0) || (local_34 == 2)) {
    local_40 = ApplicativeHelper::getNthArg(in_stack_fffffffffffffef8,0);
    in_stack_ffffffffffffff88._content = (uint64_t)local_18;
    TVar1 = ApplicativeHelper::getNthArg(in_stack_fffffffffffffef8,0);
    in_stack_ffffffffffffff80 =
         ApplicativeHelper::getResultApplieadToNArgs(in_stack_fffffffffffffef8,0);
    in_stack_ffffffffffffff78._content = (uint64_t)local_18;
    TVar2 = in_stack_ffffffffffffff80;
  }
  else {
    in_stack_ffffffffffffff70 = ApplicativeHelper::getNthArg(in_stack_fffffffffffffef8,0);
    local_40 = in_stack_ffffffffffffff70;
    TVar1 = ApplicativeHelper::getNthArg(in_stack_fffffffffffffef8,0);
    TVar2 = ApplicativeHelper::getResultApplieadToNArgs(in_stack_fffffffffffffef8,0);
  }
  Kernel::Term::create
            ((uint)(TVar1._content >> 0x20),(uint)TVar1._content,(TermList *)TVar2._content);
  Kernel::TermList::TermList(in_stack_ffffffffffffff00,(Term *)in_stack_fffffffffffffef8._content);
  Kernel::TermList::term((TermList *)0x798df5);
  Kernel::SortHelper::getResultSort((Term *)in_stack_ffffffffffffff78._content);
  TVar2 = ApplicativeHelper::createAppTerm3
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70);
  return (TermList)TVar2._content;
}

Assistant:

TermList CombinatorNormalisationISE::createSCorBTerm(TermList arg1, TermList arg1sort,
          TermList arg2, TermList arg2sort, Signature::Combinator comb)
{
  TermList s1, s2, s3;
  unsigned cb = env.signature->getCombinator(comb);
  
  if(comb == Signature::S_COMB || comb == Signature::C_COMB){
    //cout << "CCOMB arg1 " + arg1.toString() + " of sort " + arg1sort.toString() << endl; 
    s1 = AH::getNthArg(arg1sort, 1);
    s2 = AH::getNthArg(arg1sort, 2);
    s3 = AH::getResultApplieadToNArgs(arg1sort, 2);
  } else {
    //cout << "BCOMB arg1 " + arg1.toString() + " of sort " + arg1sort.toString() << endl; 
    s1 = AH::getNthArg(arg2sort, 1);
    s2 = AH::getNthArg(arg1sort, 1);
    s3 = AH::getResultApplieadToNArgs(arg1sort, 1);
  }
  
  TermList args[] = {s1, s2, s3};
  TermList c = TermList(Term::create(cb, 3, args));
  return AH::createAppTerm3(SortHelper::getResultSort(c.term()), c, arg1, arg2); 
}